

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *param,
          reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_2,
          int *param_3)

{
  std::mutex::lock(&this->guard_);
  TimedExecution::push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>
            (&this->queue_,param,param_2,param_3);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }